

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void obj_to_char(OBJ_DATA *obj,CHAR_DATA *ch)

{
  short sVar1;
  int iVar2;
  
  obj->next_content = ch->carrying;
  ch->carrying = obj;
  obj->carried_by = ch;
  sVar1 = 0;
  obj->in_room = (ROOM_INDEX_DATA *)0x0;
  obj->in_obj = (OBJ_DATA *)0x0;
  if (obj->wear_loc != 0x13) {
    if (((ulong)(ushort)obj->item_type < 0x22) &&
       ((0x300100000U >> ((ulong)(ushort)obj->item_type & 0x3f) & 1) != 0)) {
      sVar1 = 0;
    }
    else {
      sVar1 = 1;
    }
  }
  ch->carry_number = ch->carry_number + sVar1;
  iVar2 = get_obj_weight(obj);
  ch->carry_weight = ch->carry_weight + (short)iVar2;
  return;
}

Assistant:

void obj_to_char(OBJ_DATA *obj, CHAR_DATA *ch)
{
	obj->next_content = ch->carrying;
	ch->carrying = obj;
	obj->carried_by = ch;
	obj->in_room = nullptr;
	obj->in_obj = nullptr;
	ch->carry_number += get_obj_number(obj);
	ch->carry_weight += get_obj_weight(obj);
}